

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_dec_tiledecode(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  byte bVar1;
  uint_fast8_t uVar2;
  jpc_dec_ccp_t *pjVar3;
  jas_matrix_t *pjVar4;
  ulong uVar5;
  jpc_dec_cmpt_t *pjVar6;
  bool bVar7;
  _Bool _Var8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  jas_seqent_t **ppjVar14;
  long lVar15;
  jpc_dec_tcomp_t *pjVar16;
  jpc_tsfb_t **ppjVar17;
  int iVar18;
  ulong uVar19;
  jpc_dec_tcomp_t *pjVar20;
  jas_seqent_t *pjVar21;
  jas_matind_t jVar22;
  jpc_dec_cmpt_t *pjVar23;
  long lVar24;
  jas_seqent_t jVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  char *fmt;
  jpc_dec_rlvl_t *pjVar30;
  jpc_dec_band_t *pjVar31;
  long lVar32;
  
  iVar9 = jpc_dec_decodecblks(dec,tile);
  if (iVar9 != 0) {
    fmt = "jpc_dec_decodecblks failed\n";
    goto LAB_0011dbef;
  }
  iVar9 = dec->numcomps;
  if (iVar9 < 1) {
    bVar7 = true;
  }
  else {
    pjVar20 = tile->tcomps;
    lVar15 = 0;
    do {
      uVar13 = pjVar20->numrlvls;
      if (uVar13 != 0) {
        pjVar30 = pjVar20->rlvls;
        pjVar3 = tile->cp->ccps;
        uVar10 = 0;
        do {
          pjVar31 = pjVar30->bands;
          if ((pjVar31 != (jpc_dec_band_t *)0x0) && (0 < pjVar30->numbands)) {
            iVar9 = 0;
            do {
              pjVar4 = pjVar31->data;
              if (pjVar4 != (jas_matrix_t *)0x0) {
                iVar11 = pjVar31->numbps;
                iVar29 = pjVar31->roishift;
                bVar1 = pjVar3[lVar15].roishift;
                iVar18 = iVar29;
                if (iVar29 < 0) {
                  iVar18 = 0;
                  jas_eprintf(
                             "warning: forcing negative ROI shift to zero (bitstream is probably corrupt)\n"
                             );
                }
                iVar29 = (uint)bVar1 - iVar29;
                if ((iVar18 != 0 || iVar29 != 0) && (lVar28 = pjVar4->numrows_, 0 < lVar28)) {
                  uVar27 = -1L << ((byte)iVar11 & 0x3f);
                  lVar26 = pjVar4->numcols_;
                  lVar32 = 0;
                  bVar7 = false;
                  do {
                    if (0 < lVar26) {
                      ppjVar14 = pjVar4->rows_;
                      lVar28 = 0;
                      do {
                        pjVar21 = ppjVar14[lVar32];
                        uVar5 = pjVar21[lVar28];
                        uVar19 = -uVar5;
                        if (0 < (long)uVar5) {
                          uVar19 = uVar5;
                        }
                        if ((long)uVar19 < (long)(1 << ((byte)iVar18 & 0x1f))) {
                          uVar19 = uVar19 << ((byte)iVar29 & 0x3f);
                          if ((uVar19 & uVar27) != 0) {
                            if (!bVar7) {
                              jas_eprintf("warning: possibly corrupt code stream\n");
                              ppjVar14 = pjVar4->rows_;
                            }
                            uVar19 = uVar19 & ~uVar27;
                            bVar7 = true;
                          }
                          uVar12 = -uVar19;
                          if (-1 < (long)uVar5) {
                            uVar12 = uVar19;
                          }
                          pjVar21 = ppjVar14[lVar32];
                        }
                        else {
                          uVar19 = uVar19 >> ((byte)iVar18 & 0x3f);
                          uVar12 = -uVar19;
                          if (-1 < (long)uVar5) {
                            uVar12 = uVar19;
                          }
                        }
                        pjVar21[lVar28] = uVar12;
                        lVar28 = lVar28 + 1;
                        lVar26 = pjVar4->numcols_;
                      } while (lVar28 < lVar26);
                      lVar28 = pjVar4->numrows_;
                    }
                    lVar32 = lVar32 + 1;
                  } while (lVar32 < lVar28);
                }
                if (tile->realmode != 0) {
                  jas_matrix_asl(pjVar31->data,0xd);
                  lVar28 = pjVar31->absstepsize;
                  if (lVar28 < 0) {
                    __assert_fail("absstepsize >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                  ,0x797,"void jpc_dequantize(jas_matrix_t *, jpc_fix_t)");
                  }
                  if (lVar28 != 0x2000) {
                    pjVar4 = pjVar31->data;
                    jVar22 = pjVar4->numrows_;
                    if (0 < jVar22) {
                      lVar26 = pjVar4->numcols_;
                      lVar32 = 0;
                      do {
                        if (0 < lVar26) {
                          pjVar21 = pjVar4->rows_[lVar32];
                          lVar24 = 0;
                          do {
                            lVar26 = pjVar21[lVar24];
                            jVar25 = lVar26 * lVar28 >> 0xd;
                            if (lVar26 == 0) {
                              jVar25 = 0;
                            }
                            pjVar21[lVar24] = jVar25;
                            lVar24 = lVar24 + 1;
                            lVar26 = pjVar4->numcols_;
                          } while (lVar24 < lVar26);
                          jVar22 = pjVar4->numrows_;
                        }
                        lVar32 = lVar32 + 1;
                      } while (lVar32 < jVar22);
                    }
                  }
                }
              }
              iVar9 = iVar9 + 1;
              pjVar31 = pjVar31 + 1;
            } while (iVar9 < pjVar30->numbands);
            uVar13 = pjVar20->numrlvls;
          }
          uVar10 = uVar10 + 1;
          pjVar30 = pjVar30 + 1;
        } while (uVar10 < uVar13);
        iVar9 = dec->numcomps;
      }
      lVar15 = lVar15 + 1;
      pjVar20 = pjVar20 + 1;
    } while (lVar15 < iVar9);
    bVar7 = true;
    if (0 < iVar9) {
      ppjVar17 = &tile->tcomps->tsfb;
      iVar9 = 0;
      do {
        jpc_tsfb_synthesize(*ppjVar17,(jas_seq2d_t *)ppjVar17[-3]);
        iVar9 = iVar9 + 1;
        ppjVar17 = ppjVar17 + 8;
      } while (iVar9 < dec->numcomps);
      bVar7 = dec->numcomps < 3;
    }
  }
  uVar2 = tile->cp->mctid;
  if (uVar2 == '\x01') {
    if (bVar7) {
      fmt = "ICT requires at least three components\n";
      goto LAB_0011dbef;
    }
    _Var8 = jas_image_cmpt_domains_same(dec->image);
    if (!_Var8) {
LAB_0011e1a5:
      fmt = "RCT requires all components have the same domain\n";
      goto LAB_0011dbef;
    }
    pjVar20 = tile->tcomps;
    jpc_iict(pjVar20->data,pjVar20[1].data,pjVar20[2].data);
  }
  else if (uVar2 == '\x02') {
    if (bVar7) {
      fmt = "RCT requires at least three components\n";
      goto LAB_0011dbef;
    }
    _Var8 = jas_image_cmpt_domains_same(dec->image);
    if (!_Var8) goto LAB_0011e1a5;
    pjVar20 = tile->tcomps;
    jpc_irct(pjVar20->data,pjVar20[1].data,pjVar20[2].data);
  }
  pjVar20 = tile->tcomps;
  iVar9 = dec->numcomps;
  if (tile->realmode != 0) {
    if (iVar9 < 1) {
      return 0;
    }
    iVar11 = 0;
    pjVar16 = pjVar20;
    do {
      pjVar4 = pjVar16->data;
      jVar22 = pjVar4->numrows_;
      if (0 < jVar22) {
        lVar15 = pjVar4->numcols_;
        lVar28 = 0;
        do {
          if (0 < lVar15) {
            pjVar21 = pjVar4->rows_[lVar28];
            lVar26 = 0;
            do {
              iVar29 = (int)pjVar21[lVar26];
              if (iVar29 < 0) {
                iVar29 = iVar29 + 0x1000;
              }
              else {
                iVar29 = -(0x1000U - iVar29 & 0xffffe000);
              }
              pjVar21[lVar26] = (long)(iVar29 >> 0xd);
              lVar26 = lVar26 + 1;
              lVar15 = pjVar4->numcols_;
            } while (lVar26 < lVar15);
            jVar22 = pjVar4->numrows_;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < jVar22);
      }
      iVar11 = iVar11 + 1;
      pjVar16 = pjVar16 + 1;
    } while (iVar11 != iVar9);
  }
  if (0 < iVar9) {
    pjVar6 = dec->cmpts;
    iVar11 = 0;
    pjVar16 = pjVar20;
    pjVar23 = pjVar6;
    do {
      if (pjVar23->sgnd == false) {
        lVar15 = (long)(1 << ((char)pjVar23->prec - 1U & 0x1f));
      }
      else {
        lVar15 = 0;
      }
      pjVar4 = pjVar16->data;
      jVar22 = pjVar4->numrows_;
      if (0 < jVar22) {
        lVar28 = pjVar4->numcols_;
        lVar26 = 0;
        do {
          if (0 < lVar28) {
            pjVar21 = pjVar4->rows_[lVar26];
            lVar32 = 0;
            do {
              pjVar21[lVar32] = pjVar21[lVar32] + lVar15;
              lVar32 = lVar32 + 1;
              lVar28 = pjVar4->numcols_;
            } while (lVar32 < lVar28);
            jVar22 = pjVar4->numrows_;
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 < jVar22);
      }
      iVar11 = iVar11 + 1;
      pjVar16 = pjVar16 + 1;
      pjVar23 = pjVar23 + 1;
    } while (iVar11 != iVar9);
    if (0 < iVar9) {
      lVar15 = 0;
      iVar9 = 0;
      do {
        bVar1 = *(byte *)((long)&pjVar6->prec + lVar15);
        uVar13 = -1 << (bVar1 - 1 & 0x1f);
        lVar28 = (long)(int)uVar13;
        if ((&pjVar6->sgnd)[lVar15] == false) {
          lVar28 = 0;
          uVar13 = -1 << (bVar1 & 0x1f);
        }
        jas_matrix_clip(*(jas_matrix_t **)((long)&pjVar20->data + lVar15),lVar28,(ulong)~uVar13);
        iVar9 = iVar9 + 1;
        lVar15 = lVar15 + 0x40;
      } while (iVar9 < dec->numcomps);
      if (0 < dec->numcomps) {
        pjVar6 = dec->cmpts;
        pjVar20 = tile->tcomps;
        lVar15 = 0;
        fmt = "write component failed\n";
        uVar13 = 0;
        while( true ) {
          uVar27 = *(ulong *)((long)&pjVar6->hstep + lVar15);
          uVar5 = *(ulong *)((long)&pjVar6->vstep + lVar15);
          pjVar4 = *(jas_matrix_t **)((long)&pjVar20->data + lVar15);
          iVar9 = jas_image_writecmpt(dec->image,uVar13,
                                      *(long *)((long)&pjVar20->xstart + lVar15) -
                                      ((dec->xstart + uVar27) - 1) / uVar27,
                                      *(long *)((long)&pjVar20->ystart + lVar15) -
                                      ((dec->ystart + uVar5) - 1) / uVar5,pjVar4->numcols_,
                                      pjVar4->numrows_,pjVar4);
          if (iVar9 != 0) break;
          uVar13 = uVar13 + 1;
          lVar15 = lVar15 + 0x40;
          if (dec->numcomps <= (int)uVar13) {
            return 0;
          }
        }
LAB_0011dbef:
        jas_eprintf(fmt);
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

static int jpc_dec_tiledecode(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	jpc_dec_rlvl_t *rlvl;
	jpc_dec_band_t *band;
	int compno;
	unsigned rlvlno;
	int bandno;
	int adjust;
	int v;
	jpc_dec_ccp_t *ccp;
	jpc_dec_cmpt_t *cmpt;

	if (jpc_dec_decodecblks(dec, tile)) {
		jas_eprintf("jpc_dec_decodecblks failed\n");
		return -1;
	}

	/* Perform dequantization. */
	for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
	  ++compno, ++tcomp) {
		ccp = &tile->cp->ccps[compno];
		for (rlvlno = 0, rlvl = tcomp->rlvls; rlvlno < tcomp->numrlvls;
		  ++rlvlno, ++rlvl) {
			if (!rlvl->bands) {
				continue;
			}
			for (bandno = 0, band = rlvl->bands;
			  bandno < rlvl->numbands; ++bandno, ++band) {
				if (!band->data) {
					continue;
				}
				jpc_undo_roi(band->data, band->roishift, ccp->roishift -
				  band->roishift, band->numbps);
				if (tile->realmode) {
					jas_matrix_asl(band->data, JPC_FIX_FRACBITS);
					jpc_dequantize(band->data, band->absstepsize);
				}

			}
		}
	}

	/* Apply an inverse wavelet transform if necessary. */
	for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
	  ++compno, ++tcomp) {
		ccp = &tile->cp->ccps[compno];
		jpc_tsfb_synthesize(tcomp->tsfb, tcomp->data);
	}


	/* Apply an inverse intercomponent transform if necessary. */
	switch (tile->cp->mctid) {
	case JPC_MCT_RCT:
		if (dec->numcomps < 3) {
			jas_eprintf("RCT requires at least three components\n");
			return -1;
		}
		if (!jas_image_cmpt_domains_same(dec->image)) {
			jas_eprintf("RCT requires all components have the same domain\n");
			return -1;
		}
		jpc_irct(tile->tcomps[0].data, tile->tcomps[1].data,
		  tile->tcomps[2].data);
		break;
	case JPC_MCT_ICT:
		if (dec->numcomps < 3) {
			jas_eprintf("ICT requires at least three components\n");
			return -1;
		}
		if (!jas_image_cmpt_domains_same(dec->image)) {
			jas_eprintf("RCT requires all components have the same domain\n");
			return -1;
		}
		jpc_iict(tile->tcomps[0].data, tile->tcomps[1].data,
		  tile->tcomps[2].data);
		break;
	}

	/* Perform rounding and convert to integer values. */
	if (tile->realmode) {
		for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
		  ++compno, ++tcomp) {
			for (jas_matind_t i = 0; i < jas_matrix_numrows(tcomp->data); ++i) {
				for (jas_matind_t j = 0; j < jas_matrix_numcols(tcomp->data); ++j) {
					v = jas_matrix_get(tcomp->data, i, j);
					v = jpc_fix_round(v);
					jas_matrix_set(tcomp->data, i, j, jpc_fixtoint(v));
				}
			}
		}
	}

	/* Perform level shift. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		adjust = cmpt->sgnd ? 0 : (1 << (cmpt->prec - 1));
		for (jas_matind_t i = 0; i < jas_matrix_numrows(tcomp->data); ++i) {
			for (jas_matind_t j = 0; j < jas_matrix_numcols(tcomp->data); ++j) {
				*jas_matrix_getref(tcomp->data, i, j) += adjust;
			}
		}
	}

	/* Perform clipping. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		jpc_fix_t mn;
		jpc_fix_t mx;
		mn = cmpt->sgnd ? (-(1 << (cmpt->prec - 1))) : (0);
		mx = cmpt->sgnd ? ((1 << (cmpt->prec - 1)) - 1) : ((1 <<
		  cmpt->prec) - 1);
		jas_matrix_clip(tcomp->data, mn, mx);
	}

	/* XXX need to free tsfb struct */

	/* Write the data for each component of the image. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		if (jas_image_writecmpt(dec->image, compno, tcomp->xstart -
		  JPC_CEILDIV(dec->xstart, cmpt->hstep), tcomp->ystart -
		  JPC_CEILDIV(dec->ystart, cmpt->vstep), jas_matrix_numcols(
		  tcomp->data), jas_matrix_numrows(tcomp->data), tcomp->data)) {
			jas_eprintf("write component failed\n");
			return -1;
		}
	}

	return 0;
}